

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O2

void __thiscall Color::clamp(Color *this,int *r,int *g,int *b)

{
  int iVar1;
  
  iVar1 = 0xff;
  if (*r < 0x100) {
    if (*r < 0) {
      iVar1 = 0;
      goto LAB_00104fd5;
    }
  }
  else {
LAB_00104fd5:
    *r = iVar1;
  }
  iVar1 = 0xff;
  if (*g < 0x100) {
    if (-1 < *g) goto LAB_00104fee;
    iVar1 = 0;
  }
  *g = iVar1;
LAB_00104fee:
  iVar1 = 0xff;
  if (*b < 0x100) {
    if (-1 < *b) {
      return;
    }
    iVar1 = 0;
  }
  *b = iVar1;
  return;
}

Assistant:

void Color::clamp(int& r, int& g, int& b) {
    if(r > 255) {
        r = 255;
    }
    if(r < 0){
        r=0;
    }
    if(g > 255){
        g=255;
    }
    if(g < 0){
        g=0;
    }
    if(b > 255){
        b=255;
    }
    if(b<0){
        b=0;
    }
}